

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

Scalar RigidBodyDynamics::Utils::CalcKineticEnergy
                 (Model *model,VectorNd *q,VectorNd *qdot,bool update_kinematics)

{
  size_type sVar1;
  byte in_CL;
  long in_RDI;
  Scalar SVar2;
  size_t i;
  Scalar result;
  SpatialVector *in_stack_00000150;
  SpatialRigidBodyInertia *in_stack_00000158;
  VectorNd *in_stack_00000338;
  VectorNd *in_stack_00000340;
  VectorNd *in_stack_00000348;
  Model *in_stack_00000350;
  reference in_stack_ffffffffffffff28;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffff40;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
  *in_stack_ffffffffffffff48;
  dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_6>
  *in_stack_ffffffffffffff60;
  StorageBaseType *matrix;
  double *in_stack_ffffffffffffff78;
  undefined8 local_30;
  undefined8 local_28;
  
  if ((in_CL & 1) != 0) {
    UpdateKinematicsCustom(in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338);
  }
  local_28 = 0.0;
  local_30 = 1;
  while( true ) {
    sVar1 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 800));
    if (sVar1 <= local_30) break;
    matrix = (StorageBaseType *)0x3fe0000000000000;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x70),local_30);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffff28);
    Eigen::operator*(in_stack_ffffffffffffff78,matrix);
    in_stack_ffffffffffffff28 =
         std::
         vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
         ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                       *)(in_RDI + 0x270),local_30);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x70),local_30);
    Math::SpatialRigidBodyInertia::operator*(in_stack_00000158,in_stack_00000150);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,6,1,1,6>const>const,Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>const>>
    ::operator*(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffff60);
    local_28 = SVar2 + local_28;
    local_30 = local_30 + 1;
  }
  return local_28;
}

Assistant:

RBDL_DLLAPI Scalar CalcKineticEnergy (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  bool update_kinematics)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, NULL);
  }

  Scalar result = 0.;

  for (size_t i = 1; i < model.mBodies.size(); i++) {
    result += 0.5 * model.v[i].transpose() * (model.I[i] * model.v[i]);
  }
  return result;
}